

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_classify_nosse2.cpp
# Opt level: O0

int ClassifyLine2(node_t *node,FSimpleVert *v1,FSimpleVert *v2,int *sidev)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  double dist_1;
  double dist;
  double l;
  int nears;
  double s_num2;
  double s_num1;
  double d_yv2;
  double d_yv1;
  double d_xv2;
  double d_xv1;
  double d_dy;
  double d_dx;
  double d_y1;
  double d_x1;
  int *sidev_local;
  FSimpleVert *v2_local;
  FSimpleVert *v1_local;
  node_t *node_local;
  
  dVar1 = (double)node->dx;
  dVar2 = (double)node->dy;
  dVar3 = ((double)node->y - (double)v1->y) * dVar1 - ((double)node->x - (double)v1->x) * dVar2;
  dVar4 = ((double)node->y - (double)v2->y) * dVar1 - ((double)node->x - (double)v2->x) * dVar2;
  if (-17179869184.0 < dVar3) {
    if (dVar3 < 17179869184.0) {
      bVar5 = ABS(dVar4) < 17179869184.0 | 2;
    }
    else {
      if (17179869184.0 <= dVar4) {
        sidev[1] = -1;
        *sidev = -1;
        return 0;
      }
      if (dVar4 <= -17179869184.0) {
        *sidev = -1;
        sidev[1] = 1;
        return -1;
      }
      bVar5 = 1;
    }
  }
  else {
    if (dVar4 <= -17179869184.0) {
      sidev[1] = 1;
      *sidev = 1;
      return 1;
    }
    if (17179869184.0 <= dVar4) {
      *sidev = 1;
      sidev[1] = -1;
      return -1;
    }
    bVar5 = 1;
  }
  if (bVar5 == 0) {
    iVar6 = 1;
    if (0.0 < dVar3) {
      iVar6 = -1;
    }
    *sidev = iVar6;
    iVar6 = 1;
    if (0.0 < dVar4) {
      iVar6 = -1;
    }
    sidev[1] = iVar6;
  }
  else {
    dVar1 = 1.0 / (dVar1 * dVar1 + dVar2 * dVar2);
    if ((bVar5 & 2) == 0) {
      iVar6 = 1;
      if (0.0 < dVar3) {
        iVar6 = -1;
      }
      *sidev = iVar6;
    }
    else if (42.94967296 <= dVar3 * dVar3 * dVar1) {
      iVar6 = 1;
      if (0.0 < dVar3) {
        iVar6 = -1;
      }
      *sidev = iVar6;
    }
    else {
      *sidev = 0;
    }
    if ((bVar5 & 1) == 0) {
      iVar6 = 1;
      if (0.0 < dVar4) {
        iVar6 = -1;
      }
      sidev[1] = iVar6;
    }
    else if (42.94967296 <= dVar4 * dVar4 * dVar1) {
      iVar6 = 1;
      if (0.0 < dVar4) {
        iVar6 = -1;
      }
      sidev[1] = iVar6;
    }
    else {
      sidev[1] = 0;
    }
  }
  if (*sidev == 0 && sidev[1] == 0) {
    if (node->dx == 0) {
      if (((node->dy < 1) || (v2->y <= v1->y)) && ((-1 < node->dy || (v1->y <= v2->y)))) {
        node_local._4_4_ = 1;
      }
      else {
        node_local._4_4_ = 0;
      }
    }
    else if (((node->dx < 1) || (v2->x <= v1->x)) && ((-1 < node->dx || (v1->x <= v2->x)))) {
      node_local._4_4_ = 1;
    }
    else {
      node_local._4_4_ = 0;
    }
  }
  else if ((*sidev < 1) && (sidev[1] < 1)) {
    node_local._4_4_ = 0;
  }
  else if ((*sidev < 0) || (sidev[1] < 0)) {
    node_local._4_4_ = -1;
  }
  else {
    node_local._4_4_ = 1;
  }
  return node_local._4_4_;
}

Assistant:

int ClassifyLine2 (node_t &node, const FSimpleVert *v1, const FSimpleVert *v2, int sidev[2])
{
	double d_x1 = double(node.x);
	double d_y1 = double(node.y);
	double d_dx = double(node.dx);
	double d_dy = double(node.dy);
	double d_xv1 = double(v1->x);
	double d_xv2 = double(v2->x);
	double d_yv1 = double(v1->y);
	double d_yv2 = double(v2->y);

	double s_num1 = (d_y1 - d_yv1) * d_dx - (d_x1 - d_xv1) * d_dy;
	double s_num2 = (d_y1 - d_yv2) * d_dx - (d_x1 - d_xv2) * d_dy;

	int nears = 0;

	if (s_num1 <= -FAR_ENOUGH)
	{
		if (s_num2 <= -FAR_ENOUGH)
		{
			sidev[0] = sidev[1] = 1;
			return 1;
		}
		if (s_num2 >= FAR_ENOUGH)
		{
			sidev[0] = 1;
			sidev[1] = -1;
			return -1;
		}
		nears = 1;
	}
	else if (s_num1 >= FAR_ENOUGH)
	{
		if (s_num2 >= FAR_ENOUGH)
		{
			sidev[0] = sidev[1] = -1;
			return 0;
		}
		if (s_num2 <= -FAR_ENOUGH)
		{
			sidev[0] = -1;
			sidev[1] = 1;
			return -1;
		}
		nears = 1;
	}
	else
	{
		nears = 2 | int(fabs(s_num2) < FAR_ENOUGH);
	}

	if (nears)
	{
		double l = 1.f / (d_dx*d_dx + d_dy*d_dy);
		if (nears & 2)
		{
			double dist = s_num1 * s_num1 * l;
			if (dist < SIDE_EPSILON*SIDE_EPSILON)
			{
				sidev[0] = 0;
			}
			else
			{
				sidev[0] = s_num1 > 0.0 ? -1 : 1;
			}
		}
		else
		{
			sidev[0] = s_num1 > 0.0 ? -1 : 1;
		}
		if (nears & 1)
		{
			double dist = s_num2 * s_num2 * l;
			if (dist < SIDE_EPSILON*SIDE_EPSILON)
			{
				sidev[1] = 0;
			}
			else
			{
				sidev[1] = s_num2 > 0.0 ? -1 : 1;
			}
		}
		else
		{
			sidev[1] = s_num2 > 0.0 ? -1 : 1;
		}
	}
	else
	{
		sidev[0] = s_num1 > 0.0 ? -1 : 1;
		sidev[1] = s_num2 > 0.0 ? -1 : 1;
	}

	if ((sidev[0] | sidev[1]) == 0)
	{ // seg is coplanar with the splitter, so use its orientation to determine
	  // which child it ends up in. If it faces the same direction as the splitter,
	  // it goes in front. Otherwise, it goes in back.

		if (node.dx != 0)
		{
			if ((node.dx > 0 && v2->x > v1->x) || (node.dx < 0 && v2->x < v1->x))
			{
				return 0;
			}
			else
			{
				return 1;
			}
		}
		else
		{
			if ((node.dy > 0 && v2->y > v1->y) || (node.dy < 0 && v2->y < v1->y))
			{
				return 0;
			}
			else
			{
				return 1;
			}
		}
	}
	else if (sidev[0] <= 0 && sidev[1] <= 0)
	{
		return 0;
	}
	else if (sidev[0] >= 0 && sidev[1] >= 0)
	{
		return 1;
	}
	return -1;
}